

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_c_b94.c
# Opt level: O1

void hyb_mgga_xc_b94_hyb_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double par;
  double par_00;
  double par_01;
  double dVar2;
  
  par = get_ext_param(p,ext_params,0);
  par_00 = get_ext_param(p,ext_params,1);
  par_01 = get_ext_param(p,ext_params,2);
  dVar2 = get_ext_param(p,ext_params,3);
  xc_func_set_ext_params_name(*p->func_aux,"_at",0.0);
  xc_func_set_ext_params_name(*p->func_aux,"_gamma",par);
  xc_func_set_ext_params_name(p->func_aux[1],"_gamma",par);
  xc_func_set_ext_params_name(p->func_aux[1],"_css",par_00);
  xc_func_set_ext_params_name(p->func_aux[1],"_cab",par_01);
  pdVar1 = p->mix_coef;
  *pdVar1 = 1.0 - dVar2;
  pdVar1[1] = 1.0;
  p->cam_alpha = dVar2;
  return;
}

Assistant:

static void
hyb_mgga_xc_b94_hyb_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double gamma, css, cab, cx;

  assert(p != NULL);

  gamma = get_ext_param(p, ext_params, 0);
  css = get_ext_param(p, ext_params, 1);
  cab = get_ext_param(p, ext_params, 2);
  cx = get_ext_param(p, ext_params, 3);

  xc_func_set_ext_params_name(p->func_aux[0], "_at", 0.0);
  xc_func_set_ext_params_name(p->func_aux[0], "_gamma", gamma);
  xc_func_set_ext_params_name(p->func_aux[1], "_gamma", gamma);
  xc_func_set_ext_params_name(p->func_aux[1], "_css", css);
  xc_func_set_ext_params_name(p->func_aux[1], "_cab", cab);

  p->mix_coef[0] = 1.0 - cx;
  p->mix_coef[1] = 1.0;

  p->cam_alpha = cx;
}